

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_RbTree.h
# Opt level: O0

void __thiscall
axl::sl::
RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::onErase(RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          *this,Node *node)

{
  int iVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *in_RSI;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
  *in_RDI;
  bool bVar2;
  Node *w_1;
  Node *w;
  Node *p;
  Node *x;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_30;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_28;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_20;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_18;
  
  local_18 = BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
             ::replaceWithChild(in_RDI,in_RSI);
  local_20 = (in_RSI->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_parent;
  if (in_RSI->m_color != RbColor_Red) {
    while( true ) {
      bVar2 = false;
      if (local_18 != in_RDI->m_root) {
        iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor(local_18);
        bVar2 = iVar1 == 0;
      }
      if (!bVar2) break;
      if (local_18 ==
          (local_20->
          super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
          ).m_left) {
        local_28 = (local_20->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_right;
        if (local_28->m_color == RbColor_Red) {
          local_28->m_color = RbColor_Black;
          local_20->m_color = RbColor_Red;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateLeft(in_RDI,local_20);
          local_28 = (local_20->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_right;
        }
        iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                          ((local_28->
                           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                           ).m_left);
        if ((iVar1 == 0) &&
           (iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                              ((local_28->
                               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                               ).m_right), iVar1 == 0)) {
          local_28->m_color = RbColor_Red;
          local_18 = local_20;
        }
        else {
          iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                            ((local_28->
                             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                             ).m_right);
          if (iVar1 == 0) {
            ((local_28->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_left)->m_color = RbColor_Black;
            local_28->m_color = RbColor_Red;
            BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
            ::rotateRight(in_RDI,local_28);
            local_28 = (local_20->
                       super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                       ).m_right;
          }
          local_28->m_color = local_20->m_color;
          local_20->m_color = RbColor_Black;
          ((local_28->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right)->m_color = RbColor_Black;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateLeft(in_RDI,local_20);
          local_18 = in_RDI->m_root;
        }
      }
      else {
        local_30 = (local_20->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_left;
        if (local_30->m_color == RbColor_Red) {
          local_30->m_color = RbColor_Black;
          local_20->m_color = RbColor_Red;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateRight(in_RDI,local_20);
          local_30 = (local_20->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_left;
        }
        iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                          ((local_30->
                           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                           ).m_left);
        if ((iVar1 == 0) &&
           (iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                              ((local_30->
                               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                               ).m_right), iVar1 == 0)) {
          local_30->m_color = RbColor_Red;
          local_18 = local_20;
        }
        else {
          iVar1 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor
                            ((local_30->
                             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                             ).m_left);
          if (iVar1 == 0) {
            ((local_30->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_right)->m_color = RbColor_Black;
            local_30->m_color = RbColor_Red;
            BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
            ::rotateLeft(in_RDI,local_30);
            local_30 = (local_20->
                       super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                       ).m_left;
          }
          local_30->m_color = local_20->m_color;
          local_20->m_color = RbColor_Black;
          ((local_30->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left)->m_color = RbColor_Black;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateRight(in_RDI,local_20);
          local_18 = in_RDI->m_root;
        }
      }
      local_20 = (local_18->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent;
    }
    if (local_18 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
      local_18->m_color = RbColor_Black;
    }
  }
  return;
}

Assistant:

void
	onErase(Node* node) {
		Node* x = this->replaceWithChild(node);
		Node* p = node->m_parent;

		// no need to fixup red node deletion
		if (node->m_color == RbColor_Red)
			return;

		while (x != this->m_root && Node::getColor(x) == RbColor_Black) {
			// due to invariants of RB-tree black node must have a non-null sibling
			// if this sibling is red, both of its children are non-null black

			if (x == p->m_left) {
				Node *w = p->m_right; // non-null, see above

				if (w->m_color == RbColor_Red) {
					w->m_color = RbColor_Black;
					p->m_color = RbColor_Red;
					this->rotateLeft(p);
					w = p->m_right; // non-null black, see above
				}

				// w is non-null black

				if (Node::getColor(w->m_left) == RbColor_Black &&
					Node::getColor(w->m_right) == RbColor_Black) {
					w->m_color = RbColor_Red;
					x = p;
				} else { // at least one of w children is red
					if (Node::getColor(w->m_right) == RbColor_Black) {
						// w->m_pLeft is red
						w->m_left->m_color = RbColor_Black;
						w->m_color = RbColor_Red;
						this->rotateRight(w);
						w = p->m_right; // non-null black (just rotated here)
					}

					w->m_color = p->m_color;
					p->m_color = RbColor_Black;
					w->m_right->m_color = RbColor_Black; // w->m_pRight is non-null

					this->rotateLeft(p);
					x = this->m_root;
				}
			} else {
				Node *w = p->m_left; // non-null, see above

				if (w->m_color == RbColor_Red) {
					w->m_color = RbColor_Black;
					p->m_color = RbColor_Red;
					this->rotateRight(p);
					w = p->m_left; // non-null black, see above
				}

				// w is non-null black

				if (Node::getColor(w->m_left) == RbColor_Black &&
					Node::getColor(w->m_right) == RbColor_Black) {
					w->m_color = RbColor_Red;
					x = p;
				} else { // at least one of w children is red
					if (Node::getColor(w->m_left) == RbColor_Black) {
						// w->m_pRight is red
						w->m_right->m_color = RbColor_Black;
						w->m_color = RbColor_Red;
						this->rotateLeft(w);
						w = p->m_left; // non-null black (just rotated)
					}

					w->m_color = p->m_color;
					p->m_color = RbColor_Black;
					w->m_left->m_color = RbColor_Black; // w->m_pLeft is non-null

					this->rotateRight(p);
					x = this->m_root;
				}
			}

			p = x->m_parent;
		}

		if (x)
			x->m_color = RbColor_Black;

	#if (_AXL_SL_RBTREE_ASSERT_VALID)
		assertValid();
	#endif
	}